

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O3

oonf_telnet_result
oonf_viewer_telnet_help
          (autobuf *out,char *cmd,char *parameter,oonf_viewer_template *template,size_t count)

{
  char *parameter_00;
  
  parameter_00 = (char *)str_hasnextword(parameter);
  abuf_appendf(out,"%s command:\n",cmd);
  oonf_viewer_print_help(out,parameter_00,template,count);
  return TELNET_RESULT_ACTIVE;
}

Assistant:

enum oonf_telnet_result
oonf_viewer_telnet_help(
  struct autobuf *out, const char *cmd, const char *parameter, struct oonf_viewer_template *template, size_t count)
{
  const char *next;

  /* skip the layer2info command, NULL output is acceptable */
  next = str_hasnextword(parameter, cmd);

  /* print out own help text */
  abuf_appendf(out, "%s command:\n", cmd);
  oonf_viewer_print_help(out, next, template, count);

  return TELNET_RESULT_ACTIVE;
}